

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VFS.hpp
# Opt level: O0

VFSNode __thiscall VFS::CVFS::CVFSDir::Search(CVFSDir *this,string *Name)

{
  lock_guard<std::mutex> Name_00;
  bool bVar1;
  __type _Var2;
  size_type sVar3;
  __shared_ptr_access<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *this_01;
  reference pvVar4;
  mutex_type *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  VFSNode VVar5;
  string local_68;
  size_t local_38;
  size_t Pos;
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> lock;
  string *Name_local;
  CVFSDir *this_local;
  VFSNode *Ret;
  
  lock._M_device = in_RDX;
  std::lock_guard<std::mutex>::lock_guard(&local_28,(mutex_type *)(Name + 2));
  Pos._7_1_ = 0;
  std::shared_ptr<VFS::CVFSNode>::shared_ptr((shared_ptr<VFS::CVFSNode> *)this);
  bVar1 = std::
          vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>::
          empty((vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>
                 *)&Name[3]._M_string_length);
  Name_00 = lock;
  if (!bVar1) {
    sVar3 = std::
            vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>
            ::size((vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>
                    *)&Name[3]._M_string_length);
    local_38 = Search((CVFSDir *)Name,(string *)Name_00._M_device,0,sVar3 - 1);
    this_00 = (__shared_ptr_access<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              std::
              vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>
              ::operator[]((vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>
                            *)&Name[3]._M_string_length,local_38);
    this_01 = std::__shared_ptr_access<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->(this_00);
    CVFSNode::Name_abi_cxx11_(&local_68,this_01);
    _Var2 = std::operator==(&local_68,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            lock._M_device);
    std::__cxx11::string::~string((string *)&local_68);
    if (_Var2) {
      pvVar4 = std::
               vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>
               ::operator[]((vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>
                             *)&Name[3]._M_string_length,local_38);
      std::shared_ptr<VFS::CVFSNode>::operator=((shared_ptr<VFS::CVFSNode> *)this,pvVar4);
    }
  }
  Pos._7_1_ = 1;
  std::lock_guard<std::mutex>::~lock_guard(&local_28);
  VVar5.super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  VVar5.super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &this->super_CVFSNode
  ;
  return (VFSNode)VVar5.super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

VFSNode Search(const std::string &Name)
                    {
                        std::lock_guard<std::mutex> lock(m_UpdateLock);
                        VFSNode Ret;

                        if(!m_Childs.empty())
                        {
                            size_t Pos = Search(Name, 0, m_Childs.size() - 1);
                            if(m_Childs[Pos]->Name() == Name)
                                Ret = m_Childs[Pos];
                        }

                        return Ret;
                    }